

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

iterator __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>_>
::find(sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>_>
       *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  bool bVar1;
  size_t sVar2;
  EntryPointer psVar3;
  int8_t distance;
  char cVar4;
  
  sVar2 = slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    ((Hasher<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,key);
  psVar3 = this->entries + (sVar2 * -0x61c8864680b583eb >> ((this->hash_policy).shift & 0x3fU));
  cVar4 = '\0';
  while( true ) {
    if (psVar3->distance_from_desired < cVar4) {
      return (iterator)(this->entries + this->num_slots_minus_one + (long)this->max_lookups);
    }
    bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                      ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,key,
                       &(psVar3->field_1).value.first);
    if (bVar1) break;
    cVar4 = cVar4 + '\x01';
    psVar3 = psVar3 + 1;
  }
  return (iterator)psVar3;
}

Assistant:

iterator find(const FindKey & key)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer it = entries + ptrdiff_t(index);
        for (int8_t distance = 0; it->distance_from_desired >= distance; ++distance, ++it)
        {
            if (compares_equal(key, it->value))
                return { it };
        }
        return end();
    }